

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Debugger.cpp
# Opt level: O1

JsValueRef
Debugger::GetProperties
          (JsValueRef callee,bool isConstructCall,JsValueRef *arguments,unsigned_short argumentCount
          ,void *callbackState)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  LPCWSTR pWVar3;
  char16_t *format;
  ulong uVar4;
  JsValueRef local_38;
  JsValueRef properties;
  uint local_28;
  int objectHandle;
  int fromCount;
  int totalCount;
  
  local_38 = (JsValueRef)0x0;
  if (3 < argumentCount) {
    JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)
                      (arguments[1],(int *)((long)&properties + 4));
    if (JVar1 == JsNoError) {
      JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)(arguments[2],(int *)&local_28);
      if (JVar1 == JsNoError) {
        JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtNumberToInt)(arguments[3],&objectHandle);
        if (JVar1 == JsNoError) {
          JVar1 = (*ChakraRTInterface::m_jsApiHooks.pfJsrtDiagGetProperties)
                            (properties._4_4_,local_28,objectHandle,&local_38);
          if (JVar1 == JsNoError) {
            return local_38;
          }
          uVar4 = (ulong)JVar1;
          pPVar2 = PAL_get_stderr(0);
          pWVar3 = Helpers::JsErrorCodeToString(JVar1);
          format = 
          L"ERROR: ChakraRTInterface::JsDiagGetProperties(objectHandle, fromCount, totalCount, &properties) failed. JsErrorCode=0x%x (%s)\n"
          ;
        }
        else {
          uVar4 = (ulong)JVar1;
          pPVar2 = PAL_get_stderr(0);
          pWVar3 = Helpers::JsErrorCodeToString(JVar1);
          format = 
          L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[3], &totalCount) failed. JsErrorCode=0x%x (%s)\n"
          ;
        }
      }
      else {
        uVar4 = (ulong)JVar1;
        pPVar2 = PAL_get_stderr(0);
        pWVar3 = Helpers::JsErrorCodeToString(JVar1);
        format = 
        L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[2], &fromCount) failed. JsErrorCode=0x%x (%s)\n"
        ;
      }
    }
    else {
      uVar4 = (ulong)JVar1;
      pPVar2 = PAL_get_stderr(0);
      pWVar3 = Helpers::JsErrorCodeToString(JVar1);
      format = 
      L"ERROR: ChakraRTInterface::JsNumberToInt(arguments[1], &objectHandle) failed. JsErrorCode=0x%x (%s)\n"
      ;
    }
    PAL_fwprintf(pPVar2,format,uVar4,pWVar3);
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
  }
  return (JsValueRef)0x0;
}

Assistant:

JsValueRef Debugger::GetProperties(JsValueRef callee, bool isConstructCall, JsValueRef *arguments, unsigned short argumentCount, void *callbackState)
{
    JsValueRef properties = JS_INVALID_REFERENCE;
    int objectHandle;
    int fromCount;
    int totalCount;

    if (argumentCount > 3)
    {
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[1], &objectHandle));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[2], &fromCount));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsNumberToInt(arguments[3], &totalCount));
        IfJsErrorFailLogAndRet(ChakraRTInterface::JsDiagGetProperties(objectHandle, fromCount, totalCount, &properties));
    }

    return properties;
}